

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int xpathCommonTest(char *filename,char *result,int xptr,int expr)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *__filename;
  FILE *__stream;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  undefined8 *puVar8;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  int extraout_EDX;
  char *pcVar12;
  char expression [5000];
  undefined8 local_13c0;
  char local_13b8 [5000];
  
  pcVar5 = temp_directory;
  pcVar12 = filename;
  __filename = resultFilename(filename,temp_directory,".res");
  iVar4 = (int)pcVar5;
  if (__filename == (char *)0x0) {
    xpathCommonTest_cold_1();
    xmlSetGenericErrorFunc(0,ignoreGenericError);
    nb_tests = nb_tests + 1;
    if (iVar4 == 0) {
      lVar9 = xmlXPathNewContext(xpathDocument);
      uVar10 = xmlDocGetRootElement(xpathDocument);
      *(undefined8 *)(lVar9 + 8) = uVar10;
      if (extraout_EDX == 0) {
        lVar11 = xmlXPathCompile(pcVar12);
        if (lVar11 == 0) {
          uVar10 = 0;
        }
        else {
          uVar10 = xmlXPathCompiledEval(lVar11,lVar9);
          xmlXPathFreeCompExpr(lVar11);
        }
      }
      else {
        uVar10 = xmlXPathEvalExpression(pcVar12,lVar9);
      }
    }
    else {
      lVar9 = xmlXPtrNewContext(xpathDocument,0,0);
      uVar10 = xmlXPtrEval(pcVar12,lVar9);
    }
    xmlXPathDebugDumpObject(xpathOutput,uVar10,0);
    xmlXPathFreeObject(uVar10);
    xmlXPathFreeContext(lVar9);
    iVar4 = xmlSetGenericErrorFunc(0,0);
    return iVar4;
  }
  xpathOutput = (FILE *)fopen64(__filename,"wb");
  if ((FILE *)xpathOutput == (FILE *)0x0) {
    fprintf(_stderr,"failed to open output file %s\n",__filename);
  }
  else {
    local_13c0 = result;
    __stream = fopen64(filename,"rb");
    if (__stream != (FILE *)0x0) {
      pcVar5 = fgets(local_13b8,0x1194,__stream);
      if (pcVar5 != (char *)0x0) {
        do {
          sVar6 = strlen(local_13b8);
          if (0 < (int)(uint)sVar6) {
            uVar7 = (ulong)((uint)sVar6 & 0x7fffffff);
            do {
              if ((0x20 < (ulong)(byte)local_13b8[uVar7 - 1]) ||
                 ((0x100002600U >> ((ulong)(byte)local_13b8[uVar7 - 1] & 0x3f) & 1) == 0)) {
                local_13b8[uVar7 & 0xffffffff] = '\0';
                fprintf((FILE *)xpathOutput,"\n========================\nExpression: %s\n",
                        local_13b8);
                testXPath(local_13b8,xptr,expr);
                goto LAB_0010c388;
              }
              sVar6 = uVar7 - 1;
              bVar2 = 1 < (long)uVar7;
              uVar7 = sVar6;
            } while (bVar2);
          }
          local_13b8[(int)sVar6] = '\0';
LAB_0010c388:
          pcVar5 = fgets(local_13b8,0x1194,__stream);
        } while (pcVar5 != (char *)0x0);
      }
      fclose(__stream);
      fclose((FILE *)xpathOutput);
      pcVar5 = local_13c0;
      iVar4 = 0;
      if ((local_13c0 != (char *)0x0) &&
         (iVar3 = compareFiles(__filename,local_13c0), iVar4 = 0, iVar3 != 0)) {
        fprintf(_stderr,"Result for %s failed in %s\n",filename,pcVar5);
        iVar4 = iVar3;
      }
      unlink(__filename);
      goto LAB_0010c42c;
    }
    puVar8 = (undefined8 *)__xmlGenericError();
    pcVar1 = (code *)*puVar8;
    puVar8 = (undefined8 *)__xmlGenericErrorContext();
    (*pcVar1)(*puVar8,"Cannot open %s for reading\n",filename);
  }
  iVar4 = -1;
LAB_0010c42c:
  free(__filename);
  return iVar4;
}

Assistant:

static int
xpathCommonTest(const char *filename, const char *result,
                int xptr, int expr) {
    FILE *input;
    char expression[5000];
    int len, ret = 0;
    char *temp;

    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    xpathOutput = fopen(temp, "wb");
    if (xpathOutput == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        free(temp);
	return(-1);
    }

    input = fopen(filename, "rb");
    if (input == NULL) {
        xmlGenericError(xmlGenericErrorContext,
		"Cannot open %s for reading\n", filename);
        free(temp);
	return(-1);
    }
    while (fgets(expression, 4500, input) != NULL) {
	len = strlen(expression);
	len--;
	while ((len >= 0) &&
	       ((expression[len] == '\n') || (expression[len] == '\t') ||
		(expression[len] == '\r') || (expression[len] == ' '))) len--;
	expression[len + 1] = 0;
	if (len >= 0) {
	    fprintf(xpathOutput,
	            "\n========================\nExpression: %s\n",
		    expression) ;
	    testXPath(expression, xptr, expr);
	}
    }

    fclose(input);
    fclose(xpathOutput);
    if (result != NULL) {
	ret = compareFiles(temp, result);
	if (ret) {
	    fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	}
    }

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }
    return(ret);
}